

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O2

void __thiscall
Ptex::v2_2::PtexSeparableKernel::splitR(PtexSeparableKernel *this,PtexSeparableKernel *k)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  float *__src;
  int iVar5;
  
  iVar1 = this->uw;
  iVar5 = (-1 << ((this->res).ulog2 & 0x1fU)) + this->u + iVar1;
  if (iVar5 < iVar1) {
    iVar2 = this->v;
    iVar3 = this->vw;
    pfVar4 = this->ku;
    __src = this->kv;
    k->res = this->res;
    k->u = 0;
    k->v = iVar2;
    k->uw = iVar5;
    k->vw = iVar3;
    memcpy(k->kubuff,pfVar4 + ((long)iVar1 - (long)iVar5),(long)iVar5 * 4);
    memcpy(k->kvbuff,__src,(long)iVar3 << 2);
    k->ku = k->kubuff;
    k->kv = k->kvbuff;
    k->rot = 0;
    iVar5 = this->uw - iVar5;
  }
  else {
    operator=(k,this);
    k->u = k->u + (-1 << ((this->res).ulog2 & 0x1fU));
    this->u = 0;
    iVar5 = 0;
  }
  this->uw = iVar5;
  return;
}

Assistant:

void splitR(PtexSeparableKernel& k)
    {
        // split off right piece of width w into k
        int w = u + uw - res.u();

        if (w < uw) {
            // normal case - split off a portion
            //    res  u  v  uw vw  ku           kv
            k.set(res, 0, v, w, vw, ku + uw - w, kv);

            // update local
            uw -= w;
        }
        else {
            // entire kernel is split off
            k = *this;
            k.u -= res.u();
            u = 0; uw = 0;
        }
    }